

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

flatcc_builder_ref_t *
flatcc_builder_offset_vector_push(flatcc_builder_t *B,flatcc_builder_ref_t ref)

{
  flatbuffers_uoffset_t fVar1;
  uint uVar2;
  __flatcc_builder_frame_t *p_Var3;
  int iVar4;
  flatcc_builder_ref_t *pfVar5;
  
  p_Var3 = B->frame;
  if (p_Var3->type != 5) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_offset_vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x3bb,
                  "flatcc_builder_ref_t *flatcc_builder_offset_vector_push(flatcc_builder_t *, flatcc_builder_ref_t)"
                 );
  }
  fVar1 = (p_Var3->container).table.pl_end;
  if (fVar1 != 0x3fffffff) {
    (p_Var3->container).table.pl_end = fVar1 + 1;
    uVar2 = B->ds_offset;
    B->ds_offset = uVar2 + 4;
    if ((uVar2 + 4 < B->ds_limit) ||
       (iVar4 = reserve_ds(B,(ulong)(uVar2 + 5),0xfffffffc), iVar4 == 0)) {
      pfVar5 = (flatcc_builder_ref_t *)(B->ds + uVar2);
    }
    else {
      pfVar5 = (flatcc_builder_ref_t *)0x0;
    }
    if (pfVar5 != (flatcc_builder_ref_t *)0x0) {
      *pfVar5 = ref;
      return pfVar5;
    }
  }
  return (flatcc_builder_ref_t *)0x0;
}

Assistant:

flatcc_builder_ref_t *flatcc_builder_offset_vector_push(flatcc_builder_t *B, flatcc_builder_ref_t ref)
{
    flatcc_builder_ref_t *p;

    check(frame(type) == flatcc_builder_offset_vector, "expected offset vector frame");
    if (frame(container.vector.count) == max_offset_count) {
        return 0;
    }
    frame(container.vector.count) += 1;
    if (0 == (p = push_ds(B, field_size))) {
        return 0;
    }
    *p = ref;
    return p;
}